

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

long __thiscall FileReaderLZMA::Read(FileReaderLZMA *this,void *buffer,long len)

{
  SizeT SVar1;
  uint uVar2;
  size_t in_processed;
  size_t out_processed;
  ELzmaStatus status;
  size_t local_50;
  SizeT local_48;
  ELzmaStatus local_3c;
  void *local_38;
  
  local_38 = buffer;
  do {
    local_50 = this->InSize;
    local_48 = len;
    uVar2 = LzmaDec_DecodeToBuf(&this->Streamp->Stream,(Byte *)buffer,&local_48,
                                this->InBuff + this->InPos,&local_50,LZMA_FINISH_ANY,&local_3c);
    SVar1 = local_48;
    this->InPos = this->InPos + local_50;
    this->InSize = this->InSize - local_50;
    if (uVar2 != 0) {
      I_Error("Corrupt LZMA stream");
    }
    if (((local_50 == 0) && (local_48 == 0)) && (local_3c != LZMA_STATUS_FINISHED_WITH_MARK)) {
      I_Error("Corrupt LZMA stream");
    }
    if ((this->InSize == 0) && (this->SawEOF == false)) {
      FillBuffer(this);
    }
    buffer = (void *)((long)buffer + SVar1);
    len = len - SVar1;
  } while ((uVar2 == 0) && (len != 0));
  if (1 < uVar2) {
    I_Error("Corrupt LZMA stream");
  }
  if (len != 0) {
    I_Error("Ran out of data in LZMA stream");
  }
  return (long)buffer - (long)local_38;
}

Assistant:

long FileReaderLZMA::Read (void *buffer, long len)
{
	int err;
	Byte *next_out = (Byte *)buffer;

	do
	{
		ELzmaFinishMode finish_mode = LZMA_FINISH_ANY;
		ELzmaStatus status;
		size_t out_processed = len;
		size_t in_processed = InSize;

		err = LzmaDec_DecodeToBuf(&Streamp->Stream, next_out, &out_processed, InBuff + InPos, &in_processed, finish_mode, &status);
		InPos += in_processed;
		InSize -= in_processed;
		next_out += out_processed;
		len = (long)(len - out_processed);
		if (err != SZ_OK)
		{
			I_Error ("Corrupt LZMA stream");
		}
		if (in_processed == 0 && out_processed == 0)
		{
			if (status != LZMA_STATUS_FINISHED_WITH_MARK)
			{
				I_Error ("Corrupt LZMA stream");
			}
		}
		if (InSize == 0 && !SawEOF)
		{
			FillBuffer ();
		}
	} while (err == SZ_OK && len != 0);

	if (err != Z_OK && err != Z_STREAM_END)
	{
		I_Error ("Corrupt LZMA stream");
	}

	if (len != 0)
	{
		I_Error ("Ran out of data in LZMA stream");
	}

	return (long)(next_out - (Byte *)buffer);
}